

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O0

void __thiscall
merkle_tests::merkle_test_LeftSubtreeRightSubtree::test_method
          (merkle_test_LeftSubtreeRightSubtree *this)

{
  size_type sVar1;
  vector<uint256,_std::allocator<uint256>_> *pvVar2;
  long in_FS_OFFSET;
  size_t pos;
  vector<uint256,_std::allocator<uint256>_> leftRight;
  CMutableTransaction mtx;
  uint256 rootOfLR;
  uint256 rootOfRightSubtree;
  uint256 rootOfLeftSubtree;
  uint256 root;
  CBlock rightSubtreeBlock;
  CBlock leftSubtreeBlock;
  CBlock block;
  CBlock *in_stack_fffffffffffffcc8;
  CMutableTransaction *in_stack_fffffffffffffcd0;
  char *in_stack_fffffffffffffcd8;
  size_type in_stack_fffffffffffffce0;
  CBlock *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  lazy_ostream *in_stack_fffffffffffffcf8;
  const_string *file;
  unit_test_log_t *this_00;
  bool *in_stack_fffffffffffffd10;
  CBlock *__x;
  vector<uint256,_std::allocator<uint256>_> *in_stack_fffffffffffffd20;
  CBlock *block_00;
  CBlock *local_2c0;
  undefined1 local_2a0 [16];
  undefined1 local_290 [88];
  unit_test_log_t local_238 [11];
  undefined4 local_1dc;
  CMutableTransaction local_1d8;
  undefined1 local_178 [112];
  bool local_108 [112];
  vector<uint256,_std::allocator<uint256>_> local_98 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CBlock::CBlock(in_stack_fffffffffffffce8);
  CBlock::CBlock(in_stack_fffffffffffffce8);
  CBlock::CBlock(in_stack_fffffffffffffce8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  local_2c0 = (CBlock *)0x0;
  while( true ) {
    sVar1 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffffcc8);
    if (sVar1 <= local_2c0) break;
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffcc8);
    local_1dc = local_2c0._0_4_;
    ::MakeTransactionRef<CMutableTransaction>(in_stack_fffffffffffffcd0);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffcd8,(size_type)in_stack_fffffffffffffcd0);
    std::shared_ptr<const_CTransaction>::operator=
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffcd8,
               (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffcd0);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffcc8);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffcc8);
    local_2c0 = (CBlock *)((long)local_2c0 + 1);
  }
  local_2c0 = (CBlock *)0x0;
  while( true ) {
    block_00 = local_2c0;
    sVar1 = std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)in_stack_fffffffffffffcc8);
    if ((CBlock *)(sVar1 >> 1) <= block_00) break;
    in_stack_fffffffffffffd20 = local_98;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffcd8,(size_type)in_stack_fffffffffffffcd0);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_fffffffffffffcd8,(value_type *)in_stack_fffffffffffffcd0);
    local_2c0 = (CBlock *)((long)&(local_2c0->super_CBlockHeader).nVersion + 1);
  }
  sVar1 = std::
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffcc8);
  local_2c0 = (CBlock *)(sVar1 >> 1);
  while( true ) {
    __x = local_2c0;
    pvVar2 = (vector<uint256,_std::allocator<uint256>_> *)
             std::
             vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     *)in_stack_fffffffffffffcc8);
    if (pvVar2 <= __x) break;
    in_stack_fffffffffffffd10 = local_108;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_fffffffffffffcd8,(size_type)in_stack_fffffffffffffcd0);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_fffffffffffffcd8,(value_type *)in_stack_fffffffffffffcd0);
    local_2c0 = (CBlock *)
                ((long)&(((_Vector_base<uint256,_std::allocator<uint256>_> *)
                         &local_2c0->super_CBlockHeader)->_M_impl).super__Vector_impl_data._M_start
                + 1);
  }
  BlockMerkleRoot(block_00,(bool *)in_stack_fffffffffffffd20);
  BlockMerkleRoot(block_00,(bool *)in_stack_fffffffffffffd20);
  BlockMerkleRoot(block_00,(bool *)in_stack_fffffffffffffd20);
  this_00 = local_238;
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcc8);
  std::vector<uint256,_std::allocator<uint256>_>::push_back
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcd8,
             (value_type *)in_stack_fffffffffffffcd0);
  std::vector<uint256,_std::allocator<uint256>_>::push_back
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcd8,
             (value_type *)in_stack_fffffffffffffcd0);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            (in_stack_fffffffffffffd20,(vector<uint256,_std::allocator<uint256>_> *)__x);
  ComputeMerkleRoot((vector<uint256,_std::allocator<uint256>_> *)__x,in_stack_fffffffffffffd10);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcd8);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcd8,
               (pointer)in_stack_fffffffffffffcd0,(unsigned_long)in_stack_fffffffffffffcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffffcf8,
               (const_string *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0));
    in_stack_fffffffffffffcf8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffcd0,(char (*) [1])in_stack_fffffffffffffcc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcd8,
               (pointer)in_stack_fffffffffffffcd0,(unsigned_long)in_stack_fffffffffffffcc8);
    in_stack_fffffffffffffcd8 = "rootOfLR";
    in_stack_fffffffffffffcd0 = &local_1d8;
    in_stack_fffffffffffffcc8 = (CBlock *)0x1d1f4a0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_290,local_2a0,0x147,1,2,local_178);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcc8);
    in_stack_fffffffffffffcf7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffcf7);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcd8);
  CBlock::~CBlock(in_stack_fffffffffffffcc8);
  CBlock::~CBlock(in_stack_fffffffffffffcc8);
  CBlock::~CBlock(in_stack_fffffffffffffcc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test_LeftSubtreeRightSubtree)
{
    CBlock block, leftSubtreeBlock, rightSubtreeBlock;

    block.vtx.resize(4);
    std::size_t pos;
    for (pos = 0; pos < block.vtx.size(); pos++) {
        CMutableTransaction mtx;
        mtx.nLockTime = pos;
        block.vtx[pos] = MakeTransactionRef(std::move(mtx));
    }

    for (pos = 0; pos < block.vtx.size() / 2; pos++)
        leftSubtreeBlock.vtx.push_back(block.vtx[pos]);

    for (pos = block.vtx.size() / 2; pos < block.vtx.size(); pos++)
        rightSubtreeBlock.vtx.push_back(block.vtx[pos]);

    uint256 root = BlockMerkleRoot(block);
    uint256 rootOfLeftSubtree = BlockMerkleRoot(leftSubtreeBlock);
    uint256 rootOfRightSubtree = BlockMerkleRoot(rightSubtreeBlock);
    std::vector<uint256> leftRight;
    leftRight.push_back(rootOfLeftSubtree);
    leftRight.push_back(rootOfRightSubtree);
    uint256 rootOfLR = ComputeMerkleRoot(leftRight);

    BOOST_CHECK_EQUAL(root, rootOfLR);
}